

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void store_pool_error(png_store *ps,png_const_structp pp,char *msg)

{
  if (pp == (png_const_structp)0x0) {
    store_log(ps,(png_const_structp)0x0,msg,1);
    return;
  }
  png_error(pp,msg);
}

Assistant:

static void
store_pool_error(png_store *ps, png_const_structp pp, const char *msg)
{
   if (pp != NULL)
      png_error(pp, msg);

   /* Else we have to do it ourselves.  png_error eventually calls store_log,
    * above.  store_log accepts a NULL png_structp - it just changes what gets
    * output by store_message.
    */
   store_log(ps, pp, msg, 1 /* error */);
}